

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall CppGenerator::aggregateGenerator(CppGenerator *this,size_t group_id,TDNode *node)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var2;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var3;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar4;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar5;
  vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  *pvVar6;
  vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  *pvVar7;
  _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
  *p_Var8;
  _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
  *p_Var9;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var10;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var11;
  _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var12;
  _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var13;
  vector<ProductAggregate,_std::allocator<ProductAggregate>_> *pvVar14;
  vector<ProductAggregate,_std::allocator<ProductAggregate>_> *pvVar15;
  _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var16;
  _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var17;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  *p_Var18;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  *p_Var19;
  pointer pvVar20;
  pointer pvVar21;
  pointer pvVar22;
  Aggregate *pAVar23;
  size_t *psVar24;
  vector<DependentComputation,_std::allocator<DependentComputation>_> *this_00;
  size_t sVar25;
  View *pVVar26;
  ostream *poVar27;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  *this_02;
  _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
  *this_03;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_04;
  _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_05;
  vector<ProductAggregate,_std::allocator<ProductAggregate>_> *this_06;
  _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_07;
  _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  *this_08;
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar28;
  ulong uVar29;
  size_t var;
  pointer this_09;
  ulong uVar30;
  pointer this_10;
  size_t agg_id;
  ulong uVar31;
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  *pvVar32;
  size_t *incViewID;
  size_t *psVar33;
  Aggregate aggregate;
  dyn_bitset loopFactors;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localAggReg;
  allocator_type local_141;
  View *local_140;
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  *local_138;
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  *local_130;
  TDNode *local_128;
  vector<DependentComputation,_std::allocator<DependentComputation>_> *local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  *local_110;
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  *local_108;
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  *local_100;
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  *local_f8;
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  *local_f0;
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_e8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_e0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_d8;
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  *local_d0;
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  *local_c8;
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  *local_c0;
  size_t local_b8;
  pointer local_b0;
  Aggregate local_a8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  value_type local_58;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_48;
  
  local_140 = (View *)(group_id * 3);
  pvVar1 = this->groupVariableOrder;
  local_b0 = (this->groupVariableOrderBitset).
             super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
             super__Vector_impl_data._M_start + group_id;
  (this->aggregateHeader)._M_string_length = 0;
  *(this->aggregateHeader)._M_dataplus._M_p = '\0';
  local_128 = node;
  local_b8 = group_id;
  computeViewLevel(this,group_id,node);
  local_138 = &this->localProductList;
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear(local_138);
  p_Var2 = &((this->localProductMap).
             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var3 = &((this->localProductMap).
             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_01 = p_Var2;
  if (p_Var3 != p_Var2) {
    do {
      std::
      _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != p_Var3);
    (this->localProductMap).
    super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
  }
  pvVar4 = (this->contributingViewList).
           super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->contributingViewList).
           super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar28 = pvVar4;
  if (pvVar5 != pvVar4) {
    do {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(pvVar28);
      pvVar28 = pvVar28 + 1;
    } while (pvVar28 != pvVar5);
    (this->contributingViewList).
    super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  }
  pvVar6 = (this->viewProductList).
           super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (this->viewProductList).
           super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = pvVar6;
  if (pvVar7 != pvVar6) {
    do {
      std::
      vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
      ::~vector(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != pvVar7);
    (this->viewProductList).
    super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
  }
  p_Var8 = &((this->viewProductMap).
             super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var9 = &((this->viewProductMap).
             super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_03 = p_Var8;
  if (p_Var9 != p_Var8) {
    do {
      std::
      _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
      ::~_Rb_tree(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != p_Var9);
    (this->viewProductMap).
    super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var8;
  }
  local_c8 = &this->newAggregateRegister;
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear(local_c8);
  p_Var10 = &((this->aggregateRegisterMap).
              super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var11 = &((this->aggregateRegisterMap).
              super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_04 = p_Var10;
  if (p_Var11 != p_Var10) {
    do {
      std::
      _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != p_Var11);
    (this->aggregateRegisterMap).
    super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
  }
  p_Var12 = &((this->productToVariableMap).
              super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var13 = &((this->productToVariableMap).
              super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_05 = p_Var12;
  if (p_Var13 != p_Var12) {
    do {
      std::
      _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != p_Var13);
    (this->productToVariableMap).
    super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var12;
  }
  pvVar14 = (this->productToVariableRegister).
            super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar15 = (this->productToVariableRegister).
            super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_06 = pvVar14;
  if (pvVar15 != pvVar14) {
    do {
      std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::~vector(this_06);
      this_06 = this_06 + 1;
    } while (this_06 != pvVar15);
    (this->productToVariableRegister).
    super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar14;
  }
  local_d0 = &this->postRegisterList;
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::clear(local_d0);
  p_Var16 = &((this->postRegisterMap).
              super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var17 = &((this->postRegisterMap).
              super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_07 = p_Var16;
  if (p_Var17 != p_Var16) {
    do {
      std::
      _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_07);
      this_07 = this_07 + 1;
    } while (this_07 != p_Var17);
    (this->postRegisterMap).
    super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var16;
  }
  p_Var18 = &((this->totalLoopFactors).
              super__Vector_base<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var19 = &((this->totalLoopFactors).
              super__Vector_base<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_08 = p_Var18;
  if (p_Var19 != p_Var18) {
    do {
      std::
      _Rb_tree<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::_Select1st<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
      ::~_Rb_tree(this_08);
      this_08 = this_08 + 1;
    } while (this_08 != p_Var19);
    (this->totalLoopFactors).
    super__Vector_base<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var18;
  }
  pvVar4 = (this->totalLoopFactorList).
           super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->totalLoopFactorList).
           super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar28 = pvVar4;
  if (pvVar5 != pvVar4) {
    do {
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(pvVar28);
      pvVar28 = pvVar28 + 1;
    } while (pvVar28 != pvVar5);
    (this->totalLoopFactorList).
    super__Vector_base<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar4;
  }
  local_110 = &this->viewProductList;
  local_108 = &this->viewProductMap;
  local_100 = &this->aggregateRegisterMap;
  local_c0 = &this->productToVariableMap;
  local_120 = (vector<DependentComputation,_std::allocator<DependentComputation>_> *)
              &this->productToVariableRegister;
  local_f8 = &this->postRegisterMap;
  local_f0 = &this->totalLoopFactors;
  local_e8 = &this->totalLoopFactorList;
  local_e0 = &this->productLoopID;
  local_118 = pvVar1 + group_id;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(local_e0);
  local_d8 = &this->incViewLoopID;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(local_d8);
  local_130 = &this->aggregateComputation;
  pvVar20 = (this->aggregateComputation).
            super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar21 = (this->aggregateComputation).
            super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_09 = pvVar20;
  if (pvVar21 != pvVar20) {
    do {
      std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::~vector(this_09);
      this_09 = this_09 + 1;
    } while (this_09 != pvVar21);
    (this->aggregateComputation).
    super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar20;
  }
  pvVar1 = local_118;
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize(local_138,
           (long)(local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize(&this->localProductMap,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize(&this->contributingViewList,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::resize(local_110,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::resize(local_108,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize(local_c8,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(local_100,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::resize(local_d0,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(local_f8,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  ::resize(local_f0,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize(local_e8,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(local_e0,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(local_d8,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->aggRegLoopID,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->aggregateRemapping,
           ((long)(this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->localProductRemapping,
           ((long)(this->localProductList).
                  super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->localProductList).
                  super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->viewProductRemapping,
           ((long)(this->viewProductList).
                  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->viewProductList).
                  super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->postRemapping);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->postRemapping,
           ((long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  std::
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ::resize(local_c0,(long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::resize((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
            *)local_120,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 2);
  sVar25 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  std::
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  ::resize(local_130,sVar25);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize(&this->newAggregateRemapping,
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3);
  pvVar22 = (this->viewGroups).
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_138 = *(vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                **)((long)&(pvVar22->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + (long)local_140 * 8);
  local_130 = *(vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                **)((long)&(pvVar22->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data + (long)local_140 * 8 + 8);
  if ((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
       *)local_138 != local_130) {
    local_120 = &this->dependentComputation;
    do {
      local_140 = QueryCompiler::getView
                            ((this->_qc).
                             super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             *(size_t *)local_138);
      pAVar23 = *(local_140->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (local_128->_numOfNeighbors - (ulong)(local_140->_origin != local_140->_destination) !=
          (ulong)((long)*(pointer *)
                         ((long)&(pAVar23->_incoming).
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl + 8) -
                  *(long *)&(pAVar23->_incoming).
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data >> 4) /
          (ulong)(((long)*(pointer *)
                          ((long)&(pAVar23->_agg).
                                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                  ._M_impl + 8) -
                   *(long *)&(pAVar23->_agg).
                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                             ._M_impl >> 6) * -0x5555555555555555)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Why is this?! \n ",0x10);
        pVVar26 = local_140;
        poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
        poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
        std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
        poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
        std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
        poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
        std::__ostream_insert<char,std::char_traits<char>>(poVar27,"  ",2);
        poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
        std::__ostream_insert<char,std::char_traits<char>>(poVar27,"\n",1);
        if ((pVVar26->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pVVar26->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar30 = 0;
          do {
            pAVar23 = (pVVar26->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar30];
            if (*(pointer *)
                 ((long)&(pAVar23->_incoming).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl + 8) !=
                (pAVar23->_incoming).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar29 = 0;
              do {
                poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar27," ",1);
                poVar27 = std::ostream::_M_insert<unsigned_long>((ulong)poVar27);
                std::__ostream_insert<char,std::char_traits<char>>(poVar27," - ",3);
                uVar29 = uVar29 + 1;
                pAVar23 = (pVVar26->_aggregates).
                          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar30];
              } while (uVar29 < (ulong)((long)*(pointer *)
                                               ((long)&(pAVar23->_incoming).
                                                                                                              
                                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                                  ._M_impl + 8) -
                                        *(long *)&(pAVar23->_incoming).
                                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                                  ._M_impl.super__Vector_impl_data >> 4));
            }
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            uVar30 = uVar30 + 1;
          } while (uVar30 < (ulong)((long)(pVVar26->_aggregates).
                                          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pVVar26->_aggregates).
                                          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        exit(1);
      }
      sVar25 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_78,sVar25 + 1,0,(allocator<unsigned_long> *)&local_a8);
      uVar30 = 0;
      do {
        uVar31 = uVar30 >> 6;
        uVar29 = 1L << ((byte)uVar30 & 0x3f);
        if ((((local_140->_fVars).super__Base_bitset<2UL>._M_w[uVar31] >> (uVar30 & 0x3f) & 1) != 0)
           && (((local_b0->super__Base_bitset<2UL>)._M_w[uVar31] & uVar29) == 0)) {
          if (((local_128->_bag).super__Base_bitset<2UL>._M_w[uVar31] & uVar29) == 0) {
            psVar24 = this->incomingViews[*(size_t *)local_138].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (psVar33 = this->incomingViews[*(size_t *)local_138].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; psVar33 != psVar24;
                psVar33 = psVar33 + 1) {
              pVVar26 = QueryCompiler::getView
                                  ((this->_qc).
                                   super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,*psVar33);
              if (((pVVar26->_fVars).super__Base_bitset<2UL>._M_w[uVar31] & uVar29) != 0) {
                local_78.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[*psVar33 >> 6] =
                     local_78.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[*psVar33 >> 6] | 1L << ((byte)*psVar33 & 0x3f)
                ;
              }
            }
          }
          else {
            sVar25 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            local_78.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar25 >> 6] =
                 local_78.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[sVar25 >> 6] | 1L << ((byte)sVar25 & 0x3f)
            ;
          }
        }
        pvVar32 = local_138;
        uVar30 = uVar30 + 1;
      } while (uVar30 != 100);
      this_10 = (this->outViewLoop).
                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *(size_t *)local_138;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this_10->m_bits,&local_78.m_bits);
      sVar25 = local_b8;
      pvVar1 = local_118;
      this_10->m_num_bits = local_78.m_num_bits;
      if ((local_140->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (local_140->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        agg_id = 0;
        do {
          pAVar23 = (local_140->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_start[agg_id];
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                    (&local_a8._agg,&pAVar23->_agg);
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::vector(&local_a8._incoming,&pAVar23->_incoming);
          local_58.first =
               (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 3;
          local_58.second = 0;
          std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::vector(&local_48,
                   ((long)local_a8._agg.
                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_a8._agg.
                          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x5555555555555555,
                   &local_58,&local_141);
          this_00 = local_120;
          std::vector<DependentComputation,_std::allocator<DependentComputation>_>::clear(local_120)
          ;
          std::vector<DependentComputation,_std::allocator<DependentComputation>_>::resize
                    (this_00,((long)local_a8._agg.
                                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8._agg.
                                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6) *
                             -0x5555555555555555);
          pvVar32 = local_138;
          registerAggregatesToVariables
                    (this,&local_a8,sVar25,*(size_t *)local_138,agg_id,0,&local_48);
          if (local_48.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a8._incoming.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8._incoming.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a8._agg.
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
              .super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8._agg.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          agg_id = agg_id + 1;
        } while (agg_id < (ulong)((long)(local_140->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_140->_aggregates).
                                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      if (local_78.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_138 = (vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                   *)((long)pvVar32 + 8);
    } while ((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
              *)local_138 != local_130);
  }
  return;
}

Assistant:

void CppGenerator::aggregateGenerator(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    aggregateHeader.clear();

    // Compute the level of the views in this group 
    computeViewLevel(group_id,node);
    
    // TODO: TODO: TODO: Make sure the below is necessary 
    localProductList.clear();
    localProductMap.clear();
    contributingViewList.clear();
    
    viewProductList.clear();
    viewProductMap.clear();

    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    
    productToVariableMap.clear();
    productToVariableRegister.clear();

    postRegisterList.clear();
    postRegisterMap.clear();

    totalLoopFactors.clear();
    totalLoopFactorList.clear();
    
    productLoopID.clear();
    incViewLoopID.clear();

    aggregateComputation.clear();
    
    localProductList.resize(varOrder.size() * 2);
    localProductMap.resize(varOrder.size()* 2);
    contributingViewList.resize(varOrder.size() * 2);
    
    viewProductList.resize(varOrder.size() * 2);
    viewProductMap.resize(varOrder.size() * 2);

    newAggregateRegister.resize(varOrder.size());
    aggregateRegisterMap.resize(varOrder.size());

    postRegisterList.resize(varOrder.size());
    postRegisterMap.resize(varOrder.size());

    totalLoopFactors.resize(varOrder.size() * 2);
    totalLoopFactorList.resize(varOrder.size());
    
    productLoopID.resize(varOrder.size() * 2);
    incViewLoopID.resize(varOrder.size() * 2);
    aggRegLoopID.resize(varOrder.size() * 2);

    aggregateRemapping.resize(newAggregateRegister.size());
    localProductRemapping.resize(localProductList.size());
    viewProductRemapping.resize(viewProductList.size());

    postRemapping.clear();
    postRemapping.resize(varOrder.size() + 1);

    productToVariableMap.resize(varOrder.size()*2);
    productToVariableRegister.resize(varOrder.size()*2);

    aggregateComputation.resize(_qc->numberOfViews());

    newAggregateRemapping.resize(varOrder.size());
    // localProductRemapping.resize(varOrder.size());
    // viewProductRemapping.resize(varOrder.size());
    // TODO: TODO: TODO: TODO: TODO: check if the above is correct 
    
    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);


        size_t numberIncomingViews =
            (view->_origin == view->_destination ? node._numOfNeighbors :
             node._numOfNeighbors - 1);
        
        if (numberIncomingViews !=
            view->_aggregates[0]->_incoming.size() / view->_aggregates[0]->_agg.size())
        {
            ERROR("Why is this?! \n ");
            ERROR(view->_origin << " " << view->_destination << " " <<
                  node._numOfNeighbors << " " <<
                  view->_aggregates[0]->_incoming.size()  << "  " << 
                  view->_aggregates[0]->_agg.size()  << "\n");

            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                size_t incCounter = 0;
                for (size_t inc = 0; inc <
                         view->_aggregates[aggNo]->_incoming.size(); ++inc)
                {
                    std::cout << view->_aggregates[aggNo]->_incoming[incCounter].first
                              << " " <<
                        view->_aggregates[aggNo]->_incoming[incCounter].second << " - ";
                    incCounter++;
                }
                std::cout << std::endl;
            }
            exit(1);
        }

        dyn_bitset loopFactors(_qc->numberOfViews()+1);

        // Compute the loops that are required by this view. 
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                if (!varOrderBitset[var])
                {
                    // if var is in relation - use relation 
                    if (node._bag[var])
                    {                                   
                        loopFactors.set(_qc->numberOfViews());
                    }
                    else // else find corresponding view 
                    {
                        for (const size_t& incViewID : incomingViews[viewID])
                        {
                            if (_qc->getView(incViewID)->_fVars[var])
                                loopFactors.set(incViewID);
                        }
                    }
                }
            }
        }

        outViewLoop[viewID] = loopFactors;
        
        // We add loop Factors for this view to the totalLoopFactors and keep
        // track of the id.
        // if (viewLevelRegister[viewID] != varOrder.size())
        // {            
        //     size_t depDepth = varOrder.size() + viewLevelRegister[viewID];
        //     auto loopit = totalLoopFactors[depDepth].find(loopFactors);
        //     if (loopit != totalLoopFactors[depDepth].end())
        //     {
        //         outViewLoopID[viewID] = loopit->second;
        //     }
        //     else
        //     {
        //         size_t loopID = totalLoopFactors[depDepth].size();
        //         outViewLoopID[viewID] = loopID;            
        //         totalLoopFactors[depDepth][loopFactors] = loopID;
        //     }
        // }
        
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            // We use a copy of the actual aggregate
            Aggregate aggregate = *(view->_aggregates[aggNo]);

            std::vector<std::pair<size_t, size_t>>
                localAggReg(aggregate._agg.size(),{varOrder.size(), 0});

            dependentComputation.clear();
            dependentComputation.resize(aggregate._agg.size());

            // computeAggregateRegister(&aggregate,group_id,viewID,aggNo,0,localAggReg);
            registerAggregatesToVariables
                (&aggregate,group_id,viewID,aggNo,0,localAggReg);
        }
    }

    // DINFO("Registered Aggregates to Variables \n"); 
}